

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

uint __thiscall Kernel::Clause::getLiteralPosition(Clause *this,Literal *lit)

{
  uint uVar1;
  DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *this_00;
  Entry *pEVar2;
  uint uVar3;
  void **head;
  Literal *local_28;
  
  uVar3 = *(uint *)&this->field_0x38 & 0xfffff;
  uVar1 = 0;
  if (uVar3 != 1) {
    if (uVar3 == 3) {
      if (this->_literals[0] != lit) {
        uVar1 = (*(Literal **)&this[1].super_Unit != lit) + 1;
      }
    }
    else if (uVar3 == 2) {
      uVar1 = (uint)(this->_literals[0] != lit);
    }
    else {
      this_00 = &this->_literalPositions->_data;
      if (this_00 ==
          (DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0) {
        this_00 = (DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                  Lib::FixedSizeAllocator<48UL>::alloc
                            ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                            );
        Lib::InverseLookup<Kernel::Literal>::InverseLookup<Kernel::Literal**>
                  ((InverseLookup<Kernel::Literal> *)this_00,this->_literals,
                   (ulong)((uint)*(undefined8 *)&this->field_0x38 & 0xfffff));
        this->_literalPositions = (InverseLookup<Kernel::Literal> *)this_00;
      }
      local_28 = lit;
      pEVar2 = Lib::DHMap<Kernel::Literal_*,_unsigned_long,_Lib::DefaultHash,_Lib::DefaultHash2>::
               findEntry(this_00,&local_28);
      uVar1 = (uint)pEVar2->_val;
    }
  }
  return uVar1;
}

Assistant:

unsigned Clause::getLiteralPosition(Literal* lit)
{
  switch(length()) {
  case 1:
    ASS_EQ(lit,(*this)[0]);
    return 0;
  case 2:
    if (lit==(*this)[0]) {
      return 0;
    } else {
      ASS_EQ(lit,(*this)[1]);
      return 1;
    }
  case 3:
    if (lit==(*this)[0]) {
      return 0;
    } else if (lit==(*this)[1]) {
      return 1;
    } else {
      ASS_EQ(lit,(*this)[2]);
      return 2;
    }
#if VDEBUG
  case 0:
    ASSERTION_VIOLATION;
#endif
  default:
    if (!_literalPositions) {
      _literalPositions=new InverseLookup<Literal>(_literals,length());
    }
    return static_cast<unsigned>(_literalPositions->get(lit));
  }
}